

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O3

void __thiscall pg::QPTSolver::run(QPTSolver *this)

{
  ulong uVar1;
  size_t sVar2;
  unsigned_long uVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  int *piVar7;
  uint *puVar8;
  size_t sVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  Game *pGVar14;
  long lVar15;
  int max1;
  int max0;
  int k1;
  int k0;
  unsigned_long goal1;
  unsigned_long goal0;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  unsigned_long local_68;
  unsigned_long local_60;
  long local_58;
  size_t local_50;
  int local_44;
  size_t local_40;
  long local_38;
  
  updateState(this,&local_60,&local_68,&local_7c,&local_80,&local_70,&local_78);
  poVar5 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"for odd with even measures: n0=",0x1f);
  uVar3 = local_60;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", k=",4);
  plVar6 = (long *)std::ostream::operator<<(poVar5,local_70);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  poVar5 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"for even with odd measures: n1=",0x1f);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", k=",4);
  iVar12 = local_78;
  plVar6 = (long *)std::ostream::operator<<(poVar5,local_78);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  pGVar14 = (this->super_Solver).game;
  local_6c = iVar12;
  if (iVar12 < local_70) {
    local_6c = local_70;
  }
  uVar1 = pGVar14->n_vertices;
  piVar7 = (int *)operator_new__(-(ulong)((long)local_6c * uVar1 >> 0x3e != 0) |
                                 (long)local_6c * uVar1 * 4);
  this->pm_nodes = piVar7;
  piVar7 = (int *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 << 2);
  this->strategy = piVar7;
  (this->todo).pointer = 0;
  puVar8 = (this->todo).queue;
  if (puVar8 != (uint *)0x0) {
    operator_delete__(puVar8);
    pGVar14 = (this->super_Solver).game;
  }
  puVar8 = (uint *)operator_new__(uVar1 << 2 & 0x3fffffffc);
  (this->todo).queue = puVar8;
  bitset::resize(&this->dirty,pGVar14->n_vertices);
  this->lift_count = 0;
  this->lift_attempt = 0;
  if (this->bounded == true) {
    if (local_6c < 1) {
      iVar12 = 1;
    }
    else {
      iVar12 = 1;
      do {
        pGVar14 = (this->super_Solver).game;
        local_58 = this->lift_count;
        local_38 = this->lift_attempt;
        lVar10 = pGVar14->n_vertices;
        local_40 = bitset::count(&pGVar14->solved);
        iVar11 = local_7c;
        this->pl = 0;
        this->k = iVar12;
        this->max = local_7c;
        local_44 = local_80;
        iVar4 = local_80;
        if (local_80 == -1) {
          iVar4 = 0;
        }
        this->maxo = iVar4;
        this->goal = local_60;
        local_74 = iVar12;
        liftloop(this);
        pGVar14 = (this->super_Solver).game;
        sVar2 = pGVar14->n_vertices;
        local_50 = bitset::count(&pGVar14->solved);
        poVar5 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"after even with k=",0x12);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->k);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        *(undefined8 *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = 9;
        poVar5 = std::ostream::_M_insert<long>((long)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," lifts, ",8);
        *(undefined8 *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = 9;
        poVar5 = std::ostream::_M_insert<long>((long)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," lift attempts, ",0x10);
        sVar9 = local_50;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," unsolved left.",0xf);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        iVar12 = local_74;
        if (sVar2 == sVar9) break;
        local_58 = lVar10 - local_40;
        iVar12 = local_44;
        if (sVar2 - sVar9 != local_58) {
          updateState(this,&local_60,&local_68,&local_7c,&local_80,&local_70,&local_78);
          iVar11 = local_7c;
          iVar12 = local_80;
        }
        local_50 = this->lift_count;
        if (iVar11 == -1) {
          iVar11 = 1;
        }
        this->pl = 1;
        this->k = local_74;
        this->max = iVar12;
        this->maxo = iVar11;
        this->goal = local_68;
        liftloop(this);
        pGVar14 = (this->super_Solver).game;
        sVar2 = pGVar14->n_vertices;
        sVar9 = bitset::count(&pGVar14->solved);
        poVar5 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"after odd  with k=",0x12);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->k);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        *(undefined8 *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = 9;
        poVar5 = std::ostream::_M_insert<long>((long)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," lifts, ",8);
        *(undefined8 *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = 9;
        poVar5 = std::ostream::_M_insert<long>((long)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," lift attempts, ",0x10);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," unsolved left.",0xf);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        lVar10 = local_58;
        lVar15 = sVar2 - sVar9;
        iVar12 = local_74;
        if (sVar2 == sVar9) break;
        if (lVar15 != local_58) {
          updateState(this,&local_60,&local_68,&local_7c,&local_80,&local_70,&local_78);
        }
        iVar12 = (local_74 - (uint)(lVar15 != lVar10)) + 1;
      } while (iVar12 <= local_6c);
    }
    poVar5 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"solved with ",0xc);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," lifts, ",8);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," lift attempts, max k ",0x16);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar12);
    pcVar13 = ".";
    lVar10 = 1;
  }
  else {
    this->pl = 0;
    this->k = local_70;
    this->max = local_7c;
    iVar12 = local_80;
    if (local_80 == -1) {
      iVar12 = 0;
    }
    this->maxo = iVar12;
    this->goal = uVar3;
    liftloop(this);
    pGVar14 = (this->super_Solver).game;
    sVar2 = pGVar14->n_vertices;
    sVar9 = bitset::count(&pGVar14->solved);
    poVar5 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"after even, ",0xc);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," lifts, ",8);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," lift attempts, ",0x10);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," unsolved left.",0xf);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (sVar2 != sVar9) {
      updateState(this,&local_60,&local_68,&local_7c,&local_80,&local_70,&local_78);
      this->pl = 1;
      this->k = local_78;
      this->max = local_80;
      if (local_7c == -1) {
        local_7c = 1;
      }
      this->maxo = local_7c;
      this->goal = local_68;
      liftloop(this);
    }
    poVar5 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"solved with ",0xc);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," lifts, ",8);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    pcVar13 = " lift attempts.";
    lVar10 = 0xf;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar13,lVar10);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (this->pm_nodes != (int *)0x0) {
    operator_delete__(this->pm_nodes);
  }
  if (this->strategy == (int *)0x0) {
    return;
  }
  operator_delete__(this->strategy);
  return;
}

Assistant:

void
QPTSolver::run()
{
    unsigned long goal0, goal1;
    int max0, max1;
    int k0, k1;

    updateState(goal0, goal1, max0, max1, k0, k1);
    
    logger << "for odd with even measures: n0=" << goal0 << ", k=" << k0 << std::endl;
    logger << "for even with odd measures: n1=" << goal1 << ", k=" << k1 << std::endl;

    // for allocation, just use biggest k
    int big_k = k0 > k1 ? k0 : k1;

    // now create the data structure, for each vertex a PM
    pm_nodes = new int[big_k * nodecount()];
    strategy = new int[nodecount()];

    // initialize todo/dirty queues
    todo.resize(nodecount());
    dirty.resize(nodecount());

    lift_count = 0;
    lift_attempt = 0;

    if (bounded) {
        int i;
        for (i=1; i<=big_k; i++) {
            long _l = lift_count, _a = lift_attempt;
            uint64_t _c = game.count_unsolved();
            uint64_t c = _c;

            /*if (i <= k0)*/ {
                pl = 0;
                k = i;
                max = max0;
                maxo = max1 != -1 ? max1 : 0; // used in bump
                goal = goal0;
                liftloop();

                c = game.count_unsolved();
                logger << "after even with k=" << k << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
                if (c == 0) break;

                if (c != _c) updateState(goal0, goal1, max0, max1, k0, k1);
                _l = lift_count;
                _a = lift_attempt;
            }
            /*if (i <= k1)*/ {
                pl = 1;
                k = i;
                max = max1;
                maxo = max0 != -1 ? max0 : 1; // used in bump
                goal = goal1;
                liftloop();

                c = game.count_unsolved();
                logger << "after odd  with k=" << k << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
                if (c == 0) break;

                if (c != _c) updateState(goal0, goal1, max0, max1, k0, k1);
            }
            if (c != _c) i--;
        } 

        logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts, max k " << i << "." << std::endl;
    } else if (ODDFIRST) {
        pl = 1;
        k = k1;
        max = max1;
        maxo = max0 != -1 ? max0 : 1; // used in bump
        goal = goal1;
        liftloop();

        uint64_t c = game.count_unsolved();
        logger << "after odd, " << lift_count << " lifts, " << lift_attempt << " lift attempts, " << c << " unsolved left." << std::endl;

        if (c != 0) {
            updateState(goal0, goal1, max0, max1, k0, k1);

            pl = 0;
            k = k0;
            max = max0;
            maxo = max1 != -1 ? max1 : 0; // used in bump
            goal = goal0;
            liftloop();
        }

        logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
    } else {
        pl = 0;
        k = k0;
        max = max0;
        maxo = max1 != -1 ? max1 : 0; // used in bump
        goal = goal0;
        liftloop();

        uint64_t c = game.count_unsolved();
        logger << "after even, " << lift_count << " lifts, " << lift_attempt << " lift attempts, " << c << " unsolved left." << std::endl;

        if (c != 0) {
            updateState(goal0, goal1, max0, max1, k0, k1);

            pl = 1;
            k = k1;
            max = max1;
            maxo = max0 != -1 ? max0 : 1; // used in bump
            goal = goal1;
            liftloop();
        }

        logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
    }

    delete[] pm_nodes;
    delete[] strategy;
}